

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O0

void __thiscall QFSFileEngine::QFSFileEngine(QFSFileEngine *this,QString *file)

{
  long lVar1;
  QFileSystemEntry *dd;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QFSFileEnginePrivate *d;
  undefined **this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &PTR__QFSFileEngine_001f34e0;
  *in_RDI = &PTR__QFSFileEngine_001f34e0;
  dd = (QFileSystemEntry *)operator_new(200);
  QFSFileEnginePrivate::QFSFileEnginePrivate
            ((QFSFileEnginePrivate *)this_00,(QAbstractFileEngine *)dd);
  QAbstractFileEngine::QAbstractFileEngine
            ((QAbstractFileEngine *)this_00,(QAbstractFileEnginePrivate *)dd);
  *in_RDI = this_00;
  d_func((QFSFileEngine *)0x1340c4);
  QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)this_00,&dd->m_filePath);
  QFileSystemEntry::operator=((QFileSystemEntry *)this_00,dd);
  QFileSystemEntry::~QFileSystemEntry((QFileSystemEntry *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QFSFileEngine::QFSFileEngine(const QString &file)
    : QAbstractFileEngine(*new QFSFileEnginePrivate(this))
{
    Q_D(QFSFileEngine);
    d->fileEntry = QFileSystemEntry(file);
}